

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flagser.h
# Opt level: O2

filtered_directed_graph_t *
read_graph_flagser(filtered_directed_graph_t *__return_storage_ptr__,string *filename,
                  flagser_parameters *params)

{
  float __val;
  float fVar1;
  ulong uVar2;
  runtime_error *this;
  int iVar3;
  size_type sVar4;
  bool bVar5;
  float fVar6;
  int local_56c;
  vector<float,_std::allocator<float>_> vertex_filtration;
  vector<float,_std::allocator<float>_> vertices;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vertices_1;
  string line;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  string err_msg;
  _Vector_base<float,_std::allocator<float>_> local_250;
  ifstream input_stream;
  byte abStack_218 [488];
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_directed_graph_t).indegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).indegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).outdegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).indegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).outdegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).outdegrees.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edge_filtration.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edge_filtration.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edges.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edge_filtration.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edges.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).edges.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).directed = true;
  (__return_storage_ptr__->super_directed_graph_t).incidence_incoming.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_incoming.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_incoming.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_outgoing.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_outgoing.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_directed_graph_t).incidence_outgoing.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vertex_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->edge_filtration).super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&input_stream);
  std::__cxx11::string::string((string *)&local_348,(string *)filename);
  open_file(&local_348,&input_stream);
  std::__cxx11::string::~string((string *)&local_348);
  local_56c = 0;
  bVar5 = true;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            if ((abStack_218[*(long *)(_input_stream + -0x18)] & 2) != 0) {
              std::ifstream::~ifstream(&input_stream);
              std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                        (&vertex_filtration.super__Vector_base<float,_std::allocator<float>_>);
              std::__cxx11::string::~string((string *)&line);
              return __return_storage_ptr__;
            }
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&input_stream,(string *)&line);
            trim(&err_msg,&line);
            std::__cxx11::string::operator=((string *)&line,(string *)&err_msg);
            std::__cxx11::string::~string((string *)&err_msg);
          } while (line._M_string_length == 0);
          if (((*line._M_dataplus._M_p != 'd') || (line._M_dataplus._M_p[1] != 'i')) ||
             (line._M_dataplus._M_p[2] != 'm')) break;
          if (line._M_dataplus._M_p[4] == '1') {
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_250,&vertex_filtration);
            filtered_directed_graph_t::filtered_directed_graph_t
                      ((filtered_directed_graph_t *)&err_msg,
                       (vector<float,_std::allocator<float>_> *)&local_250,params->directed);
            filtered_directed_graph_t::operator=
                      (__return_storage_ptr__,(filtered_directed_graph_t *)&err_msg);
            filtered_directed_graph_t::~filtered_directed_graph_t
                      ((filtered_directed_graph_t *)&err_msg);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_250);
            bVar5 = false;
            local_56c = 1;
          }
        }
        if (!bVar5) break;
        if (vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start ==
            vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          err_msg._M_string_length = 0;
          err_msg._M_dataplus._M_p = (pointer)string_to_float;
          err_msg.field_2._8_8_ =
               std::
               _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               ::_M_invoke;
          err_msg.field_2._M_allocated_capacity =
               (size_type)
               std::
               _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               ::_M_manager;
          split<float>((vector<float,_std::allocator<float>_> *)&vertices_1,&line,' ',
                       (function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&err_msg);
          std::vector<float,_std::allocator<float>_>::_M_move_assign
                    (&vertex_filtration,(_Vector_base<float,_std::allocator<float>_> *)&vertices_1);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&vertices_1);
          std::_Function_base::~_Function_base((_Function_base *)&err_msg);
        }
      }
      if (local_56c != 3) break;
LAB_00130a28:
      err_msg._M_string_length = 0;
      err_msg._M_dataplus._M_p = (pointer)string_to_uint;
      err_msg.field_2._8_8_ =
           std::
           _Function_handler<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_unsigned_int_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
           ::_M_invoke;
      err_msg.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_unsigned_int_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
           ::_M_manager;
      split<unsigned_short>
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 &vertices_1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>,
                 &line,' ',
                 (function<unsigned_short_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&err_msg);
      std::_Function_base::~_Function_base((_Function_base *)&err_msg);
      directed_graph_t::add_edge
                (&__return_storage_ptr__->super_directed_graph_t,
                 *vertices_1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                 vertices_1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start[1]);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&vertices_1.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      local_56c = 3;
    }
    if (local_56c == 1) {
      iVar3 = 0;
      for (sVar4 = 0; line._M_string_length != sVar4; sVar4 = sVar4 + 1) {
        iVar3 = iVar3 + (uint)(line._M_dataplus._M_p[sVar4] == ' ');
      }
      local_56c = 2;
      if (iVar3 == 1) goto LAB_00130a28;
    }
    err_msg._M_string_length = 0;
    err_msg._M_dataplus._M_p = (pointer)string_to_float;
    err_msg.field_2._8_8_ =
         std::
         _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
         ::_M_invoke;
    err_msg.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_float_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
         ::_M_manager;
    split<float>(&vertices,&line,' ',
                 (function<float_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)&err_msg);
    std::_Function_base::~_Function_base((_Function_base *)&err_msg);
    __val = *vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar1 = vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    fVar6 = vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start
            [(long)fVar1 >> 0x3f & (long)(fVar1 - 9.223372e+18) | (long)fVar1];
    if (vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start
        [(long)fVar1 >> 0x3f & (long)(fVar1 - 9.223372e+18) | (long)fVar1] <=
        vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start
        [(long)__val >> 0x3f & (long)(__val - 9.223372e+18) | (long)__val]) {
      fVar6 = vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start
              [(long)__val >> 0x3f & (long)(__val - 9.223372e+18) | (long)__val];
    }
    if (vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[2] < fVar6) {
      std::__cxx11::to_string(&local_468,__val);
      std::operator+(&local_448,
                     "The flagser file contained an edge filtration that contradicts the vertex filtration, the edge ("
                     ,&local_468);
      std::operator+(&local_428,&local_448,", ");
      std::__cxx11::to_string
                (&local_488,
                 vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[1]);
      std::operator+(&local_408,&local_428,&local_488);
      std::operator+(&local_3e8,&local_408,") has filtration value ");
      std::__cxx11::to_string
                (&local_4a8,
                 vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[2]);
      std::operator+(&local_3c8,&local_3e8,&local_4a8);
      std::operator+(&local_3a8,&local_3c8,", which is lower than min(");
      uVar2 = (ulong)*vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
      std::__cxx11::to_string
                (&local_4c8,
                 vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(long)(*vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start - 9.223372e+18) & (long)uVar2 >> 0x3f |
                  uVar2]);
      std::operator+(&local_388,&local_3a8,&local_4c8);
      std::operator+(&local_368,&local_388,", ");
      uVar2 = (ulong)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[1];
      std::__cxx11::to_string
                (&local_4e8,
                 vertex_filtration.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(long)(vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[1] - 9.223372e+18) & (long)uVar2 >> 0x3f |
                  uVar2]);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vertices_1,&local_368,&local_4e8);
      std::operator+(&err_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &vertices_1,"), the filtrations of its vertices.");
      std::__cxx11::string::~string((string *)&vertices_1);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_468);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,(string *)&err_msg);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    filtered_directed_graph_t::add_filtered_edge
              (__return_storage_ptr__,(vertex_index_t)(int)__val,(vertex_index_t)(int)fVar1,
               vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[2]);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&vertices.super__Vector_base<float,_std::allocator<float>_>);
  } while( true );
}

Assistant:

filtered_directed_graph_t read_graph_flagser(const std::string filename, const flagser_parameters& params) {
	std::string line;
	filtered_directed_graph_t graph{};
	int current_dimension = 0;
	std::vector<value_t> vertex_filtration;
	HAS_EDGE_FILTRATION has_edge_filtration = HAS_EDGE_FILTRATION::TOO_EARLY_TO_DECIDE;

	std::ifstream input_stream;
	open_file(filename, input_stream);

	while (not input_stream.eof()) {
		getline(input_stream, line);
		line = trim(line);
		if (line.length() == 0) continue;
		if (line[0] == 'd' && line[1] == 'i' && line[2] == 'm') {
			if (line[4] == '1') {
				graph = filtered_directed_graph_t(vertex_filtration, params.directed);
				current_dimension = 1;
				has_edge_filtration = HAS_EDGE_FILTRATION::MAYBE;
			}
			continue;
		}

		if (current_dimension == 0) {
			if (vertex_filtration.empty()) vertex_filtration = split<value_t>(line, ' ', string_to_float);
		} else {
			if (has_edge_filtration == HAS_EDGE_FILTRATION::MAYBE) {
				// If the edge has three components, then there are also filtration values, which we assume to come last
				int number_of_spaces = 0;
				for (auto& iter : line)
					if (iter == ' ') { number_of_spaces++; }
				has_edge_filtration = number_of_spaces == 1 ? HAS_EDGE_FILTRATION::NO : HAS_EDGE_FILTRATION::YES;
			}

			if (has_edge_filtration == NO) {
				std::vector<vertex_index_t> vertices = split<vertex_index_t>(line, ' ', string_to_uint);
				graph.add_edge(vertices[0], vertices[1]);
			} else {
				std::vector<value_t> vertices = split<value_t>(line, ' ', string_to_float);
				if (value_t(vertices[2]) <
				    std::max(vertex_filtration[size_t(vertices[0])], vertex_filtration[size_t(vertices[1])])) {
					std::string err_msg =
					    "The flagser file contained an edge filtration that contradicts the vertex "
					    "filtration, the edge (" +
					    std::to_string(vertices[0]) + ", " + std::to_string(vertices[1]) + ") has filtration value " +
					    std::to_string(vertices[2]) + ", which is lower than min(" +
					    std::to_string(vertex_filtration[size_t(vertices[0])]) + ", " +
					    std::to_string(vertex_filtration[size_t(vertices[1])]) + "), the filtrations of its vertices.";
					throw std::runtime_error(err_msg);
				}
				graph.add_filtered_edge((vertex_index_t)vertices[0], (vertex_index_t)vertices[1], vertices[2]);
			}
		}
	}

	return graph;
}